

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O1

void kb_trans(u_short keycode,u_short upflg)

{
  ulong uVar1;
  ushort uVar2;
  DLword DVar3;
  byte bVar4;
  
  bVar4 = (byte)keycode;
  if (keycode < 0x40) {
    uVar2 = (ushort)(1 << (~bVar4 & 0xf));
    if (upflg == 0) {
      uVar1 = ((ulong)EmKbdAd068K ^ 2) + (ulong)(keycode >> 3 & 6);
LAB_001290cd:
      *(ushort *)(uVar1 ^ 2) = *(ushort *)(uVar1 ^ 2) & ~uVar2;
      return;
    }
    uVar1 = ((ulong)EmKbdAd068K ^ 2) + (ulong)(keycode >> 3 & 6);
  }
  else {
    if (keycode < 0x50) {
      uVar2 = (ushort)(1 << (~bVar4 & 0xf));
      if (upflg == 0) {
        DVar3 = ~uVar2 & *EmRealUtilin68K;
      }
      else {
        DVar3 = uVar2 | *EmRealUtilin68K;
      }
      *EmRealUtilin68K = DVar3;
      uVar2 = (ushort)(1 << (~bVar4 & 0xf));
      if (upflg == 0) {
        DVar3 = ~uVar2 & *EmUtilin68K;
      }
      else {
        DVar3 = uVar2 | *EmUtilin68K;
      }
      *EmUtilin68K = DVar3;
      return;
    }
    uVar2 = (ushort)(1 << (~bVar4 & 0xf));
    if (upflg == 0) {
      uVar1 = ((ulong)EmKbdAd068K ^ 2) + (ulong)((keycode - 0x10 & 0xffff) >> 4) * 2;
      goto LAB_001290cd;
    }
    uVar1 = ((ulong)EmKbdAd068K ^ 2) + (ulong)((keycode - 0x10 & 0xffff) >> 4) * 2;
  }
  *(ushort *)(uVar1 ^ 2) = *(ushort *)(uVar1 ^ 2) | uVar2;
  return;
}

Assistant:

void kb_trans(u_short keycode, u_short upflg)
{
  if (keycode < 64) /* DLKBDAD0 ~ 3	*/
  {
    PUTBASEBIT68K(EmKbdAd068K, keycode, upflg);
  } else if (keycode >= 80) /* DLKBDAD4, 5	*/
  {
    PUTBASEBIT68K(EmKbdAd068K, keycode - 16, upflg);
  } else if (keycode >= 64 && keycode < 80) /* DLUTILIN	*/
  {
    PUTBASEBIT68K(EmRealUtilin68K, (keycode & 15), upflg);
    PUTBASEBIT68K(EmUtilin68K, (keycode & 15), upflg);
  }
}